

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall Js::IndexPropertyDescriptorMap::EnsureIndexList(IndexPropertyDescriptorMap *this)

{
  uint32 uVar1;
  uint **ppuVar2;
  Recycler *pRVar3;
  uint *ptr;
  int local_54;
  int i;
  TrackAllocData local_40;
  int local_14;
  IndexPropertyDescriptorMap *pIStack_10;
  int length;
  IndexPropertyDescriptorMap *this_local;
  
  pIStack_10 = this;
  ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                      ((WriteBarrierPtr *)&this->indexList);
  if (*ppuVar2 == (uint *)0x0) {
    local_14 = Count(this);
    pRVar3 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&unsigned_int::typeinfo,0,(long)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
               ,0x3a);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_40);
    ptr = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                    ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeaf,0,(long)local_14);
    Memory::WriteBarrierPtr<unsigned_int>::operator=(&this->indexList,ptr);
    this->lastIndexAt = -1;
    for (local_54 = 0; local_54 < local_14; local_54 = local_54 + 1) {
      uVar1 = GetKeyAt(this,local_54);
      ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                          ((WriteBarrierPtr *)&this->indexList);
      (*ppuVar2)[local_54] = uVar1;
    }
    ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                        ((WriteBarrierPtr *)&this->indexList);
    qsort(*ppuVar2,(long)local_14,4,CompareIndex);
  }
  return;
}

Assistant:

void IndexPropertyDescriptorMap::EnsureIndexList()
    {
        if (!indexList)
        {
            int length = Count();
            indexList = RecyclerNewArrayLeaf(recycler, uint32, length);
            lastIndexAt = -1; // Reset lastAccessorIndexAt

            for (int i = 0; i < length; i++)
            {
                indexList[i] = GetKeyAt(i);
            }

            ::qsort(indexList, length, sizeof(uint32), &CompareIndex);
        }
    }